

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O0

void * update_thread(void *args)

{
  size_t in_RDI;
  fdb_kvs_handle *kv;
  person_t p;
  int n;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  person_t *in_stack_fffffffffffff170;
  void *in_stack_fffffffffffff190;
  size_t in_stack_fffffffffffff198;
  void *in_stack_fffffffffffff1a0;
  fdb_kvs_handle *in_stack_fffffffffffff1a8;
  char acStack_a6c [2572];
  int local_60;
  int local_5c;
  __time_t local_38;
  __suseconds_t local_30;
  timeval local_18;
  size_t local_8;
  
  local_8 = in_RDI;
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  local_38 = local_18.tv_sec;
  local_30 = local_18.tv_usec;
  local_5c = 0;
  local_60 = 100000;
  gen_person(in_stack_fffffffffffff170);
  for (local_5c = 0; local_5c < local_60; local_5c = local_5c + 1) {
    strlen(&stack0xfffffffffffff194);
    strlen(acStack_a6c);
    fdb_set_kv(in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
               in_stack_fffffffffffff190,local_8);
  }
  return (void *)0x0;
}

Assistant:

void *update_thread(void *args) {
    TEST_INIT();

    int i = 0, n=100000;
    person_t p;
    fdb_kvs_handle *kv = (fdb_kvs_handle *)args;

    // only generate 1 person type
    gen_person(&p);
    for (i = 0; i < n; ++i) {
        fdb_set_kv(kv, p.key, strlen(p.key),
                   p.name, strlen(p.name));
    }
    return NULL;
}